

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O0

void __thiscall
flatbuffers::vector_downward<unsigned_int>::reallocate
          (vector_downward<unsigned_int> *this,size_t len)

{
  unsigned_long *puVar1;
  uint8_t *puVar2;
  ulong local_40;
  ulong local_30;
  uint local_28;
  uint local_24;
  uint old_scratch_size;
  uint old_size;
  size_t old_reserved;
  size_t len_local;
  vector_downward<unsigned_int> *this_local;
  
  _old_scratch_size = this->reserved_;
  old_reserved = len;
  len_local = (size_t)this;
  local_24 = size(this);
  local_28 = scratch_size(this);
  if (_old_scratch_size == 0) {
    local_40 = this->initial_size_;
  }
  else {
    local_40 = _old_scratch_size >> 1;
  }
  local_30 = local_40;
  puVar1 = std::max<unsigned_long>(&old_reserved,&local_30);
  this->reserved_ = *puVar1 + this->reserved_;
  this->reserved_ =
       (this->reserved_ + this->buffer_minalign_) - 1 &
       (this->buffer_minalign_ - 1 ^ 0xffffffffffffffff);
  if (this->buf_ == (uint8_t *)0x0) {
    puVar2 = Allocate(this->allocator_,this->reserved_);
    this->buf_ = puVar2;
  }
  else {
    puVar2 = ReallocateDownward(this->allocator_,this->buf_,_old_scratch_size,this->reserved_,
                                (ulong)local_24,(ulong)local_28);
    this->buf_ = puVar2;
  }
  this->cur_ = this->buf_ + (this->reserved_ - (ulong)local_24);
  this->scratch_ = this->buf_ + local_28;
  return;
}

Assistant:

void reallocate(size_t len) {
    auto old_reserved = reserved_;
    auto old_size = size();
    auto old_scratch_size = scratch_size();
    reserved_ +=
        (std::max)(len, old_reserved ? old_reserved / 2 : initial_size_);
    reserved_ = (reserved_ + buffer_minalign_ - 1) & ~(buffer_minalign_ - 1);
    if (buf_) {
      buf_ = ReallocateDownward(allocator_, buf_, old_reserved, reserved_,
                                old_size, old_scratch_size);
    } else {
      buf_ = Allocate(allocator_, reserved_);
    }
    cur_ = buf_ + reserved_ - old_size;
    scratch_ = buf_ + old_scratch_size;
  }